

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc_heap.cpp
# Opt level: O0

void __thiscall mjs::gc_heap::allocation_context::run_destructors(allocation_context *this)

{
  bool bVar1;
  gc_type_info *this_00;
  slot local_1c;
  slot_allocation_header a;
  uint32_t pos;
  allocation_context *this_local;
  
  unique0x10000094 = this;
  for (a.size = this->start_; a.size < this->next_free_; a.size = local_1c.new_position + a.size) {
    local_1c = this->storage_[a.size];
    bVar1 = slot_allocation_header::active(&local_1c.allocation);
    if (bVar1) {
      this_00 = slot_allocation_header::type_info(&local_1c.allocation);
      gc_type_info::destroy(this_00,this->storage_ + (a.size + 1));
    }
  }
  this->next_free_ = this->start_;
  return;
}

Assistant:

void gc_heap::allocation_context::run_destructors() {
    for (uint32_t pos = start_; pos < next_free_;) {
        const auto a = storage_[pos].allocation;
        if (a.active()) {
            a.type_info().destroy(&storage_[pos+1]);
        }
        pos += a.size;
    }

    next_free_ = start_;
}